

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perlin.h
# Opt level: O3

double __thiscall perlin::noise(perlin *this,point3 *p)

{
  double dVar1;
  double __x;
  double __x_00;
  uint uVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  vec3 c [2] [2] [2];
  vec3 local_f8 [8];
  
  dVar1 = p->e[0];
  __x = p->e[1];
  __x_00 = p->e[2];
  dVar4 = floor(dVar1);
  dVar5 = floor(__x);
  dVar6 = floor(__x_00);
  memset(local_f8,0,0xc0);
  lVar13 = 0;
  bVar8 = true;
  do {
    bVar10 = bVar8;
    uVar2 = this->perm_x[(int)lVar13 + (int)dVar4 & 0xff];
    lVar14 = 0;
    bVar8 = true;
    do {
      bVar11 = bVar8;
      uVar3 = this->perm_y[(int)lVar14 + (int)dVar5 & 0xff];
      lVar15 = 0;
      bVar8 = true;
      do {
        bVar12 = bVar8;
        uVar9 = this->perm_z[(int)lVar15 + (int)dVar6 & 0xff] ^ uVar3 ^ uVar2;
        local_f8[lVar13 * 4 + lVar14 * 2 + lVar15].e[2] = this->randvec[(int)uVar9].e[2];
        dVar7 = this->randvec[(int)uVar9].e[1];
        local_f8[lVar13 * 4 + lVar14 * 2 + lVar15].e[0] = this->randvec[(int)uVar9].e[0];
        local_f8[lVar13 * 4 + lVar14 * 2 + lVar15].e[1] = dVar7;
        lVar15 = 1;
        bVar8 = false;
      } while (bVar12);
      lVar14 = 1;
      bVar8 = false;
    } while (bVar11);
    lVar13 = lVar14;
    bVar8 = false;
  } while (bVar10);
  dVar1 = perlin_interp((vec3 (*) [2] [2])local_f8,dVar1 - dVar4,__x - dVar5,__x_00 - dVar6);
  return dVar1;
}

Assistant:

double noise(const point3& p) const {
        auto u = p.x() - std::floor(p.x());
        auto v = p.y() - std::floor(p.y());
        auto w = p.z() - std::floor(p.z());

        auto i = int(std::floor(p.x()));
        auto j = int(std::floor(p.y()));
        auto k = int(std::floor(p.z()));
        vec3 c[2][2][2];

        for (int di=0; di < 2; di++)
            for (int dj=0; dj < 2; dj++)
                for (int dk=0; dk < 2; dk++)
                    c[di][dj][dk] = randvec[
                        perm_x[(i+di) & 255] ^
                        perm_y[(j+dj) & 255] ^
                        perm_z[(k+dk) & 255]
                    ];

        return perlin_interp(c, u, v, w);
    }